

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParseBalancedChunkMemoryRecover(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  xmlDocPtr val_01;
  xmlSAXHandlerPtr val_02;
  xmlChar *val_03;
  int local_74;
  int n_recover;
  int recover;
  int n_listOut;
  xmlNodePtr *listOut;
  int n_string;
  xmlChar *string;
  int n_depth;
  int depth;
  int n_user_data;
  void *user_data;
  int n_sax;
  xmlSAXHandlerPtr sax;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (sax._4_4_ = 0; (int)sax._4_4_ < 4; sax._4_4_ = sax._4_4_ + 1) {
    for (user_data._4_4_ = 0; (int)user_data._4_4_ < 2; user_data._4_4_ = user_data._4_4_ + 1) {
      for (n_depth = 0; n_depth < 3; n_depth = n_depth + 1) {
        for (string._4_4_ = 0; (int)string._4_4_ < 4; string._4_4_ = string._4_4_ + 1) {
          for (listOut._4_4_ = 0; (int)listOut._4_4_ < 5; listOut._4_4_ = listOut._4_4_ + 1) {
            for (n_recover = 0; n_recover < 1; n_recover = n_recover + 1) {
              for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
                iVar1 = xmlMemBlocks();
                val_01 = gen_xmlDocPtr(sax._4_4_,0);
                val_02 = gen_xmlSAXHandlerPtr(user_data._4_4_,1);
                _depth = gen_userdata(n_depth,2);
                iVar2 = gen_int(string._4_4_,3);
                val_03 = gen_const_xmlChar_ptr(listOut._4_4_,4);
                val = gen_int(local_74,6);
                if (val_02 == (xmlSAXHandlerPtr)&xmlDefaultSAXHandler) {
                  _depth = (void *)0x0;
                }
                val_00 = xmlParseBalancedChunkMemoryRecover(val_01,val_02,_depth,iVar2,val_03,0,val)
                ;
                desret_int(val_00);
                call_tests = call_tests + 1;
                des_xmlDocPtr(sax._4_4_,val_01,0);
                des_xmlSAXHandlerPtr(user_data._4_4_,val_02,1);
                des_userdata(n_depth,_depth,2);
                des_int(string._4_4_,iVar2,3);
                des_const_xmlChar_ptr(listOut._4_4_,val_03,4);
                des_int(local_74,val,6);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlParseBalancedChunkMemoryRecover",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val = ret_val + 1;
                  printf(" %d",(ulong)sax._4_4_);
                  printf(" %d",(ulong)user_data._4_4_);
                  printf(" %d",(ulong)(uint)n_depth);
                  printf(" %d",(ulong)string._4_4_);
                  printf(" %d",(ulong)listOut._4_4_);
                  printf(" %d",(ulong)(uint)n_recover);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParseBalancedChunkMemoryRecover(void) {
    int test_ret = 0;

#if defined(LIBXML_SAX1_ENABLED)
#ifdef LIBXML_SAX1_ENABLED
    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the document the chunk pertains to (must not be NULL) */
    int n_doc;
    xmlSAXHandlerPtr sax; /* the SAX handler block (possibly NULL) */
    int n_sax;
    void * user_data; /* The user data returned on SAX callbacks (possibly NULL) */
    int n_user_data;
    int depth; /* Used for loop detection, use 0 */
    int n_depth;
    const xmlChar * string; /* the input string in UTF8 or ISO-Latin (zero terminated) */
    int n_string;
    xmlNodePtr * listOut; /* the return value for the set of parsed nodes */
    int n_listOut;
    int recover; /* return nodes even if the data is broken (use 0) */
    int n_recover;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_sax = 0;n_sax < gen_nb_xmlSAXHandlerPtr;n_sax++) {
    for (n_user_data = 0;n_user_data < gen_nb_userdata;n_user_data++) {
    for (n_depth = 0;n_depth < gen_nb_int;n_depth++) {
    for (n_string = 0;n_string < gen_nb_const_xmlChar_ptr;n_string++) {
    for (n_listOut = 0;n_listOut < gen_nb_xmlNodePtr_ptr;n_listOut++) {
    for (n_recover = 0;n_recover < gen_nb_int;n_recover++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        sax = gen_xmlSAXHandlerPtr(n_sax, 1);
        user_data = gen_userdata(n_user_data, 2);
        depth = gen_int(n_depth, 3);
        string = gen_const_xmlChar_ptr(n_string, 4);
        listOut = gen_xmlNodePtr_ptr(n_listOut, 5);
        recover = gen_int(n_recover, 6);
        
#ifdef LIBXML_SAX1_ENABLED
        if (sax == (xmlSAXHandlerPtr)&xmlDefaultSAXHandler) user_data = NULL;
#endif


        ret_val = xmlParseBalancedChunkMemoryRecover(doc, sax, user_data, depth, string, listOut, recover);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlSAXHandlerPtr(n_sax, sax, 1);
        des_userdata(n_user_data, user_data, 2);
        des_int(n_depth, depth, 3);
        des_const_xmlChar_ptr(n_string, string, 4);
        des_xmlNodePtr_ptr(n_listOut, listOut, 5);
        des_int(n_recover, recover, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParseBalancedChunkMemoryRecover",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_sax);
            printf(" %d", n_user_data);
            printf(" %d", n_depth);
            printf(" %d", n_string);
            printf(" %d", n_listOut);
            printf(" %d", n_recover);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}